

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  long *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Ch CVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  byte in_CL;
  byte *pbVar16;
  GenericStringStream<rapidjson::UTF8<char>_> *in_RSI;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  Ch *str;
  SizeType length;
  StackStream<char> stackStream;
  bool success;
  GenericStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  size_t offset;
  uint codepoint2;
  uint codepoint;
  Ch e;
  size_t escapeOffset;
  Ch c;
  size_t i;
  char *q;
  SizeType length_1;
  unsigned_short r;
  __m128i x;
  __m128i t3;
  __m128i t2;
  __m128i t1;
  __m128i s_1;
  __m128i sp;
  __m128i bs;
  __m128i dq;
  char *nextAligned;
  char *p;
  char *ret;
  char *ret_4;
  char *ret_3;
  char *ret_5;
  char *ret_2;
  char *ret_1;
  undefined4 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7c;
  undefined1 in_stack_fffffffffffffa7d;
  undefined1 in_stack_fffffffffffffa7e;
  undefined1 uVar17;
  undefined1 in_stack_fffffffffffffa7f;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffa80;
  size_t in_stack_fffffffffffffa88;
  undefined6 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa96;
  undefined1 in_stack_fffffffffffffa97;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffab3;
  SizeType in_stack_fffffffffffffab4;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffab8;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffac0;
  bool local_506;
  bool local_4fe;
  uint in_stack_fffffffffffffbbc;
  Stack<rapidjson::CrtAllocator> *in_stack_fffffffffffffbc0;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> local_420;
  byte local_401;
  size_t local_3e8;
  uint local_3dc;
  uint local_3d8;
  byte local_3d1;
  size_t local_3d0;
  byte local_3c1;
  long *local_3c0;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *local_3b8;
  char local_3a1;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *local_3a0;
  undefined1 local_392;
  char local_391;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *local_390;
  undefined1 local_381;
  ulong local_380;
  long local_378;
  uint local_370;
  ushort local_36a;
  ulong local_368;
  ulong uStack_360;
  char local_358;
  char cStack_357;
  char cStack_356;
  char cStack_355;
  char cStack_354;
  char cStack_353;
  char cStack_352;
  char cStack_351;
  char cStack_350;
  char cStack_34f;
  char cStack_34e;
  char cStack_34d;
  char cStack_34c;
  char cStack_34b;
  char cStack_34a;
  char cStack_349;
  char local_348;
  char cStack_347;
  char cStack_346;
  char cStack_345;
  char cStack_344;
  char cStack_343;
  char cStack_342;
  char cStack_341;
  char cStack_340;
  char cStack_33f;
  char cStack_33e;
  char cStack_33d;
  char cStack_33c;
  char cStack_33b;
  char cStack_33a;
  char cStack_339;
  char local_338;
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  char cStack_330;
  char cStack_32f;
  char cStack_32e;
  char cStack_32d;
  char cStack_32c;
  char cStack_32b;
  char cStack_32a;
  char cStack_329;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  byte *local_2e8;
  byte *local_2e0;
  long *local_2d8;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  byte *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  byte local_298;
  byte bStack_297;
  byte bStack_296;
  byte bStack_295;
  byte bStack_294;
  byte bStack_293;
  byte bStack_292;
  byte bStack_291;
  byte bStack_290;
  byte bStack_28f;
  byte bStack_28e;
  byte bStack_28d;
  byte bStack_28c;
  byte bStack_28b;
  byte bStack_28a;
  byte bStack_289;
  byte local_288;
  byte bStack_287;
  byte bStack_286;
  byte bStack_285;
  byte bStack_284;
  byte bStack_283;
  byte bStack_282;
  byte bStack_281;
  byte bStack_280;
  byte bStack_27f;
  byte bStack_27e;
  byte bStack_27d;
  byte bStack_27c;
  byte bStack_27b;
  byte bStack_27a;
  byte bStack_279;
  undefined8 local_278;
  undefined8 uStack_270;
  byte local_268;
  byte bStack_267;
  byte bStack_266;
  byte bStack_265;
  byte bStack_264;
  byte bStack_263;
  byte bStack_262;
  byte bStack_261;
  byte bStack_260;
  byte bStack_25f;
  byte bStack_25e;
  byte bStack_25d;
  byte bStack_25c;
  byte bStack_25b;
  byte bStack_25a;
  byte bStack_259;
  undefined8 local_258;
  undefined8 uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  byte local_1f1;
  long *local_1f0;
  undefined1 local_1e1;
  long *local_1e0;
  undefined1 local_1d1;
  long *local_1d0;
  long *local_1c8;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *local_1c0;
  Ch local_1b1;
  long *local_1b0;
  byte local_1a8;
  byte bStack_1a7;
  byte bStack_1a6;
  byte bStack_1a5;
  byte bStack_1a4;
  byte bStack_1a3;
  byte bStack_1a2;
  byte bStack_1a1;
  byte bStack_1a0;
  byte bStack_19f;
  byte bStack_19e;
  byte bStack_19d;
  byte bStack_19c;
  byte bStack_19b;
  byte bStack_19a;
  byte bStack_199;
  undefined8 local_198;
  undefined8 uStack_190;
  uint local_184;
  long *local_180;
  uint local_174;
  long *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  ulong local_150;
  long local_148;
  ulong local_140;
  long local_138;
  long local_130;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 local_c0;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  long local_98;
  byte *local_90;
  long local_88;
  long local_80;
  undefined1 *local_78;
  long local_70;
  long local_68;
  undefined1 *local_60;
  long local_58;
  long local_50;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_48;
  long local_40;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_38;
  undefined8 *local_30;
  ulong local_28;
  long local_20;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_401 = in_CL & 1;
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy(&local_420,in_RSI);
  GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_420.s);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  StackStream<char>::StackStream((StackStream<char> *)&stack0xfffffffffffffbc0,in_RDI);
  local_3c0 = (long *)&stack0xfffffffffffffbc0;
  local_3b8 = &local_420;
LAB_001ec9f3:
  do {
    local_2d0 = local_3b8;
    local_2d8 = local_3c0;
    local_2e0 = (byte *)(local_3b8->s).src_;
    local_2e8 = (byte *)((ulong)(local_2e0 + 0xf) & 0xfffffffffffffff0);
    while (plVar5 = local_2d8, local_2e0 != local_2e8) {
      if (((*local_2e0 == 0x22) || (*local_2e0 == 0x5c)) || (*local_2e0 < 0x20)) {
        (local_2d0->s).src_ = (Ch *)local_2e0;
        goto LAB_001ed15f;
      }
      pbVar16 = local_2e0 + 1;
      bVar1 = *local_2e0;
      local_1f0 = local_2d8;
      lVar2 = *local_2d8;
      local_100 = 1;
      local_f0 = 1;
      local_2e0 = pbVar16;
      local_1f1 = bVar1;
      local_f8 = lVar2;
      local_e8 = lVar2;
      if (*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18) < 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                  ((Stack<rapidjson::CrtAllocator> *)
                   CONCAT17(in_stack_fffffffffffffa97,
                            CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)),
                   in_stack_fffffffffffffa88);
      }
      local_88 = local_100;
      local_90 = *(byte **)(lVar2 + 0x18);
      *(long *)(lVar2 + 0x18) = local_100 + *(long *)(lVar2 + 0x18);
      *local_90 = bVar1;
      local_80 = lVar2;
      *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
    }
    local_2b8 = ScanCopyUnescapedString(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
                ::dquote;
    local_2f8 = 0x2222222222222222;
    uStack_2f0 = 0x2222222222222222;
    local_2c0 = ScanCopyUnescapedString(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
                ::bslash;
    local_308 = 0x5c5c5c5c5c5c5c5c;
    uStack_300 = 0x5c5c5c5c5c5c5c5c;
    local_2c8 = ScanCopyUnescapedString(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
                ::space;
    local_318 = 0x1f1f1f1f1f1f1f1f;
    uStack_310 = 0x1f1f1f1f1f1f1f1f;
    while( true ) {
      plVar5 = local_2d8;
      local_2b0 = local_2e0;
      local_328 = *(undefined8 *)local_2e0;
      uStack_320 = *(undefined8 *)(local_2e0 + 8);
      _local_268 = local_2f8;
      uVar8 = _local_268;
      _bStack_260 = uStack_2f0;
      uVar9 = _bStack_260;
      local_258._0_1_ = (byte)local_328;
      local_258._1_1_ = (byte)((ulong)local_328 >> 8);
      local_258._2_1_ = (byte)((ulong)local_328 >> 0x10);
      local_258._3_1_ = (byte)((ulong)local_328 >> 0x18);
      local_258._4_1_ = (byte)((ulong)local_328 >> 0x20);
      local_258._5_1_ = (byte)((ulong)local_328 >> 0x28);
      local_258._6_1_ = (byte)((ulong)local_328 >> 0x30);
      local_258._7_1_ = (byte)((ulong)local_328 >> 0x38);
      uStack_250._0_1_ = (byte)uStack_320;
      uStack_250._1_1_ = (byte)((ulong)uStack_320 >> 8);
      uStack_250._2_1_ = (byte)((ulong)uStack_320 >> 0x10);
      uStack_250._3_1_ = (byte)((ulong)uStack_320 >> 0x18);
      uStack_250._4_1_ = (byte)((ulong)uStack_320 >> 0x20);
      uStack_250._5_1_ = (byte)((ulong)uStack_320 >> 0x28);
      uStack_250._6_1_ = (byte)((ulong)uStack_320 >> 0x30);
      uStack_250._7_1_ = (byte)((ulong)uStack_320 >> 0x38);
      local_268 = (byte)local_2f8;
      bStack_267 = SUB81(local_2f8,1);
      bStack_266 = SUB81(local_2f8,2);
      bStack_265 = SUB81(local_2f8,3);
      bStack_264 = SUB81(local_2f8,4);
      bStack_263 = SUB81(local_2f8,5);
      bStack_262 = SUB81(local_2f8,6);
      bStack_261 = SUB81(local_2f8,7);
      bStack_260 = (byte)uStack_2f0;
      bStack_25f = SUB81(uStack_2f0,1);
      bStack_25e = SUB81(uStack_2f0,2);
      bStack_25d = SUB81(uStack_2f0,3);
      bStack_25c = SUB81(uStack_2f0,4);
      bStack_25b = SUB81(uStack_2f0,5);
      bStack_25a = SUB81(uStack_2f0,6);
      bStack_259 = SUB81(uStack_2f0,7);
      local_338 = -((byte)local_258 == local_268);
      cStack_337 = -(local_258._1_1_ == bStack_267);
      cStack_336 = -(local_258._2_1_ == bStack_266);
      cStack_335 = -(local_258._3_1_ == bStack_265);
      cStack_334 = -(local_258._4_1_ == bStack_264);
      cStack_333 = -(local_258._5_1_ == bStack_263);
      cStack_332 = -(local_258._6_1_ == bStack_262);
      cStack_331 = -(local_258._7_1_ == bStack_261);
      cStack_330 = -((byte)uStack_250 == bStack_260);
      cStack_32f = -(uStack_250._1_1_ == bStack_25f);
      cStack_32e = -(uStack_250._2_1_ == bStack_25e);
      cStack_32d = -(uStack_250._3_1_ == bStack_25d);
      cStack_32c = -(uStack_250._4_1_ == bStack_25c);
      cStack_32b = -(uStack_250._5_1_ == bStack_25b);
      cStack_32a = -(uStack_250._6_1_ == bStack_25a);
      cStack_329 = -(uStack_250._7_1_ == bStack_259);
      _local_288 = local_308;
      uVar6 = _local_288;
      _bStack_280 = uStack_300;
      uVar7 = _bStack_280;
      local_288 = (byte)local_308;
      bStack_287 = SUB81(local_308,1);
      bStack_286 = SUB81(local_308,2);
      bStack_285 = SUB81(local_308,3);
      bStack_284 = SUB81(local_308,4);
      bStack_283 = SUB81(local_308,5);
      bStack_282 = SUB81(local_308,6);
      bStack_281 = SUB81(local_308,7);
      bStack_280 = (byte)uStack_300;
      bStack_27f = SUB81(uStack_300,1);
      bStack_27e = SUB81(uStack_300,2);
      bStack_27d = SUB81(uStack_300,3);
      bStack_27c = SUB81(uStack_300,4);
      bStack_27b = SUB81(uStack_300,5);
      bStack_27a = SUB81(uStack_300,6);
      bStack_279 = SUB81(uStack_300,7);
      local_348 = -((byte)local_258 == local_288);
      cStack_347 = -(local_258._1_1_ == bStack_287);
      cStack_346 = -(local_258._2_1_ == bStack_286);
      cStack_345 = -(local_258._3_1_ == bStack_285);
      cStack_344 = -(local_258._4_1_ == bStack_284);
      cStack_343 = -(local_258._5_1_ == bStack_283);
      cStack_342 = -(local_258._6_1_ == bStack_282);
      cStack_341 = -(local_258._7_1_ == bStack_281);
      cStack_340 = -((byte)uStack_250 == bStack_280);
      cStack_33f = -(uStack_250._1_1_ == bStack_27f);
      cStack_33e = -(uStack_250._2_1_ == bStack_27e);
      cStack_33d = -(uStack_250._3_1_ == bStack_27d);
      cStack_33c = -(uStack_250._4_1_ == bStack_27c);
      cStack_33b = -(uStack_250._5_1_ == bStack_27b);
      cStack_33a = -(uStack_250._6_1_ == bStack_27a);
      cStack_339 = -(uStack_250._7_1_ == bStack_279);
      _local_1a8 = local_318;
      uVar10 = _local_1a8;
      _bStack_1a0 = uStack_310;
      uVar11 = _bStack_1a0;
      local_1a8 = (byte)local_318;
      bStack_1a7 = SUB81(local_318,1);
      bStack_1a6 = SUB81(local_318,2);
      bStack_1a5 = SUB81(local_318,3);
      bStack_1a4 = SUB81(local_318,4);
      bStack_1a3 = SUB81(local_318,5);
      bStack_1a2 = SUB81(local_318,6);
      bStack_1a1 = SUB81(local_318,7);
      bStack_1a0 = (byte)uStack_310;
      bStack_19f = SUB81(uStack_310,1);
      bStack_19e = SUB81(uStack_310,2);
      bStack_19d = SUB81(uStack_310,3);
      bStack_19c = SUB81(uStack_310,4);
      bStack_19b = SUB81(uStack_310,5);
      bStack_19a = SUB81(uStack_310,6);
      bStack_199 = SUB81(uStack_310,7);
      local_298 = ((byte)local_258 < local_1a8) * local_1a8 |
                  ((byte)local_258 >= local_1a8) * (byte)local_258;
      bStack_297 = (local_258._1_1_ < bStack_1a7) * bStack_1a7 |
                   (local_258._1_1_ >= bStack_1a7) * local_258._1_1_;
      bStack_296 = (local_258._2_1_ < bStack_1a6) * bStack_1a6 |
                   (local_258._2_1_ >= bStack_1a6) * local_258._2_1_;
      bStack_295 = (local_258._3_1_ < bStack_1a5) * bStack_1a5 |
                   (local_258._3_1_ >= bStack_1a5) * local_258._3_1_;
      bStack_294 = (local_258._4_1_ < bStack_1a4) * bStack_1a4 |
                   (local_258._4_1_ >= bStack_1a4) * local_258._4_1_;
      bStack_293 = (local_258._5_1_ < bStack_1a3) * bStack_1a3 |
                   (local_258._5_1_ >= bStack_1a3) * local_258._5_1_;
      bStack_292 = (local_258._6_1_ < bStack_1a2) * bStack_1a2 |
                   (local_258._6_1_ >= bStack_1a2) * local_258._6_1_;
      bStack_291 = (local_258._7_1_ < bStack_1a1) * bStack_1a1 |
                   (local_258._7_1_ >= bStack_1a1) * local_258._7_1_;
      bStack_290 = ((byte)uStack_250 < bStack_1a0) * bStack_1a0 |
                   ((byte)uStack_250 >= bStack_1a0) * (byte)uStack_250;
      bStack_28f = (uStack_250._1_1_ < bStack_19f) * bStack_19f |
                   (uStack_250._1_1_ >= bStack_19f) * uStack_250._1_1_;
      bStack_28e = (uStack_250._2_1_ < bStack_19e) * bStack_19e |
                   (uStack_250._2_1_ >= bStack_19e) * uStack_250._2_1_;
      bStack_28d = (uStack_250._3_1_ < bStack_19d) * bStack_19d |
                   (uStack_250._3_1_ >= bStack_19d) * uStack_250._3_1_;
      bStack_28c = (uStack_250._4_1_ < bStack_19c) * bStack_19c |
                   (uStack_250._4_1_ >= bStack_19c) * uStack_250._4_1_;
      bStack_28b = (uStack_250._5_1_ < bStack_19b) * bStack_19b |
                   (uStack_250._5_1_ >= bStack_19b) * uStack_250._5_1_;
      bStack_28a = (uStack_250._6_1_ < bStack_19a) * bStack_19a |
                   (uStack_250._6_1_ >= bStack_19a) * uStack_250._6_1_;
      bStack_289 = (uStack_250._7_1_ < bStack_199) * bStack_199 |
                   (uStack_250._7_1_ >= bStack_199) * uStack_250._7_1_;
      local_2a8 = local_318;
      uStack_2a0 = uStack_310;
      local_358 = -(local_298 == local_1a8);
      cStack_357 = -(bStack_297 == bStack_1a7);
      cStack_356 = -(bStack_296 == bStack_1a6);
      cStack_355 = -(bStack_295 == bStack_1a5);
      cStack_354 = -(bStack_294 == bStack_1a4);
      cStack_353 = -(bStack_293 == bStack_1a3);
      cStack_352 = -(bStack_292 == bStack_1a2);
      cStack_351 = -(bStack_291 == bStack_1a1);
      cStack_350 = -(bStack_290 == bStack_1a0);
      cStack_34f = -(bStack_28f == bStack_19f);
      cStack_34e = -(bStack_28e == bStack_19e);
      cStack_34d = -(bStack_28d == bStack_19d);
      cStack_34c = -(bStack_28c == bStack_19c);
      cStack_34b = -(bStack_28b == bStack_19b);
      cStack_34a = -(bStack_28a == bStack_19a);
      cStack_349 = -(bStack_289 == bStack_199);
      local_218 = CONCAT17(cStack_331,
                           CONCAT16(cStack_332,
                                    CONCAT15(cStack_333,
                                             CONCAT14(cStack_334,
                                                      CONCAT13(cStack_335,
                                                               CONCAT12(cStack_336,
                                                                        CONCAT11(cStack_337,
                                                                                 local_338)))))));
      uStack_210 = CONCAT17(cStack_329,
                            CONCAT16(cStack_32a,
                                     CONCAT15(cStack_32b,
                                              CONCAT14(cStack_32c,
                                                       CONCAT13(cStack_32d,
                                                                CONCAT12(cStack_32e,
                                                                         CONCAT11(cStack_32f,
                                                                                  cStack_330)))))));
      local_228 = CONCAT17(cStack_341,
                           CONCAT16(cStack_342,
                                    CONCAT15(cStack_343,
                                             CONCAT14(cStack_344,
                                                      CONCAT13(cStack_345,
                                                               CONCAT12(cStack_346,
                                                                        CONCAT11(cStack_347,
                                                                                 local_348)))))));
      uStack_220 = CONCAT17(cStack_339,
                            CONCAT16(cStack_33a,
                                     CONCAT15(cStack_33b,
                                              CONCAT14(cStack_33c,
                                                       CONCAT13(cStack_33d,
                                                                CONCAT12(cStack_33e,
                                                                         CONCAT11(cStack_33f,
                                                                                  cStack_340)))))));
      local_238 = local_218 | local_228;
      uStack_230 = uStack_210 | uStack_220;
      local_248 = CONCAT17(cStack_351,
                           CONCAT16(cStack_352,
                                    CONCAT15(cStack_353,
                                             CONCAT14(cStack_354,
                                                      CONCAT13(cStack_355,
                                                               CONCAT12(cStack_356,
                                                                        CONCAT11(cStack_357,
                                                                                 local_358)))))));
      uStack_240 = CONCAT17(cStack_349,
                            CONCAT16(cStack_34a,
                                     CONCAT15(cStack_34b,
                                              CONCAT14(cStack_34c,
                                                       CONCAT13(cStack_34d,
                                                                CONCAT12(cStack_34e,
                                                                         CONCAT11(cStack_34f,
                                                                                  cStack_350)))))));
      local_368 = local_238 | local_248;
      uStack_360 = uStack_230 | uStack_240;
      auVar4._8_8_ = uStack_360;
      auVar4._0_8_ = local_368;
      local_36a = (ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                  (ushort)((byte)(uStack_360 >> 7) & 1) << 8 |
                  (ushort)((byte)(uStack_360 >> 0xf) & 1) << 9 |
                  (ushort)((byte)(uStack_360 >> 0x17) & 1) << 10 |
                  (ushort)((byte)(uStack_360 >> 0x1f) & 1) << 0xb |
                  (ushort)((byte)(uStack_360 >> 0x27) & 1) << 0xc |
                  (ushort)((byte)(uStack_360 >> 0x2f) & 1) << 0xd |
                  (ushort)((byte)(uStack_360 >> 0x37) & 1) << 0xe |
                  (ushort)(byte)(uStack_360 >> 0x3f) << 0xf;
      _local_288 = uVar6;
      _bStack_280 = uVar7;
      local_278 = local_328;
      uStack_270 = uStack_320;
      _local_268 = uVar8;
      _bStack_260 = uVar9;
      local_258 = local_328;
      uStack_250 = uStack_320;
      local_208 = local_368;
      uStack_200 = uStack_360;
      _local_1a8 = uVar10;
      _bStack_1a0 = uVar11;
      local_198 = local_328;
      uStack_190 = uStack_320;
      if (local_36a != 0) break;
      local_180 = local_2d8;
      local_184 = 0x10;
      *(int *)(local_2d8 + 1) = (int)local_2d8[1] + 0x10;
      lVar2 = *plVar5;
      local_140 = (ulong)local_184;
      local_138 = lVar2;
      local_b0 = local_140;
      local_a8 = lVar2;
      if (*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18) < (long)local_140) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                  ((Stack<rapidjson::CrtAllocator> *)
                   CONCAT17(in_stack_fffffffffffffa97,
                            CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)),
                   in_stack_fffffffffffffa88);
      }
      local_28 = local_140;
      local_158 = *(undefined8 **)(lVar2 + 0x18);
      *(ulong *)(lVar2 + 0x18) = local_140 + *(long *)(lVar2 + 0x18);
      local_168 = local_328;
      uStack_160 = uStack_320;
      *local_158 = local_328;
      local_158[1] = uStack_320;
      local_2e0 = local_2e0 + 0x10;
      local_30 = local_158;
      local_20 = lVar2;
    }
    iVar15 = 0;
    for (uVar3 = (uint)local_36a; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      iVar15 = iVar15 + 1;
    }
    iVar15 = iVar15 + 1;
    if (local_36a == 0) {
      iVar15 = 0;
    }
    local_370 = iVar15 - 1;
    if (local_370 != 0) {
      local_170 = local_2d8;
      local_174 = local_370;
      *(uint *)(local_2d8 + 1) = local_370 + (int)local_2d8[1];
      lVar2 = *plVar5;
      local_150 = (ulong)local_174;
      local_148 = lVar2;
      local_a0 = local_150;
      local_98 = lVar2;
      if (*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18) < (long)local_150) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                  ((Stack<rapidjson::CrtAllocator> *)
                   CONCAT17(in_stack_fffffffffffffa97,
                            CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)),
                   in_stack_fffffffffffffa88);
      }
      local_10 = local_150;
      local_378 = *(long *)(lVar2 + 0x18);
      *(ulong *)(lVar2 + 0x18) = local_150 + *(long *)(lVar2 + 0x18);
      for (local_380 = 0; local_380 < local_370; local_380 = local_380 + 1) {
        *(byte *)(local_378 + local_380) = local_2e0[local_380];
      }
      local_2e0 = local_2e0 + local_370;
      local_18 = local_378;
      local_8 = lVar2;
    }
    (local_2d0->s).src_ = (Ch *)local_2e0;
LAB_001ed15f:
    local_3c1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(&local_3b8->s);
    if (local_3c1 == 0x5c) {
      local_3d0 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(&local_3b8->s);
      GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_3b8->s);
      local_3d1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(&local_3b8->s);
      if (ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
          ::escape[local_3d1] == '\0') {
        if (local_3d1 == 0x75) {
          GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_3b8->s);
          local_3d8 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                                (in_stack_fffffffffffffa98,
                                 (GenericStringStream<rapidjson::UTF8<char>_> *)
                                 CONCAT17(in_stack_fffffffffffffa97,
                                          CONCAT16(in_stack_fffffffffffffa96,
                                                   in_stack_fffffffffffffa90)),
                                 in_stack_fffffffffffffa88);
          bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x1ed3a2);
          if (bVar14) goto LAB_001eda2c;
          local_4fe = 0xd7ff < local_3d8 && local_3d8 < 0xdc00;
          if (local_4fe) {
            local_390 = local_3b8;
            local_391 = '\\';
            CVar12 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(&local_3b8->s);
            bVar14 = CVar12 == local_391;
            if (bVar14) {
              GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_390->s);
            }
            bVar13 = true;
            local_381 = bVar14;
            if (bVar14) {
              local_3a0 = local_3b8;
              local_3a1 = 'u';
              CVar12 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(&local_3b8->s);
              bVar14 = CVar12 == local_3a1;
              if (bVar14) {
                GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_3a0->s);
              }
              bVar13 = !bVar14;
              local_392 = bVar14;
            }
            if (bVar13) {
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError(in_stack_fffffffffffffa80,
                            CONCAT13(in_stack_fffffffffffffa7f,
                                     CONCAT12(in_stack_fffffffffffffa7e,
                                              CONCAT11(in_stack_fffffffffffffa7d,
                                                       in_stack_fffffffffffffa7c))),0x1ed4f8);
              bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                        *)0x1ed505);
              if (bVar14) goto LAB_001eda2c;
            }
            local_3dc = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                                  (in_stack_fffffffffffffa98,
                                   (GenericStringStream<rapidjson::UTF8<char>_> *)
                                   CONCAT17(in_stack_fffffffffffffa97,
                                            CONCAT16(in_stack_fffffffffffffa96,
                                                     in_stack_fffffffffffffa90)),
                                   in_stack_fffffffffffffa88);
            bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                      *)0x1ed563);
            if (bVar14) goto LAB_001eda2c;
            local_506 = local_3dc < 0xdc00 || 0xdfff < local_3dc;
            if (local_506) {
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError(in_stack_fffffffffffffa80,
                            CONCAT13(in_stack_fffffffffffffa7f,
                                     CONCAT12(in_stack_fffffffffffffa7e,
                                              CONCAT11(in_stack_fffffffffffffa7d,
                                                       in_stack_fffffffffffffa7c))),0x1ed5d0);
              bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                        *)0x1ed5dd);
              if (bVar14) goto LAB_001eda2c;
            }
            local_3d8 = ((local_3d8 - 0xd800) * 0x400 | local_3dc - 0xdc00) + 0x10000;
          }
          UTF8<char>::
          Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                    ((StackStream<char> *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
        }
        else {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_stack_fffffffffffffa80,
                        CONCAT13(in_stack_fffffffffffffa7f,
                                 CONCAT12(in_stack_fffffffffffffa7e,
                                          CONCAT11(in_stack_fffffffffffffa7d,
                                                   in_stack_fffffffffffffa7c))),0x1ed656);
          bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x1ed663);
          if (bVar14) goto LAB_001eda2c;
        }
      }
      else {
        GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_3b8->s);
        plVar5 = local_3c0;
        uVar17 = ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
                 ::escape[local_3d1];
        local_1d0 = local_3c0;
        lVar2 = *local_3c0;
        local_120 = 1;
        local_d0 = 1;
        local_1d1 = uVar17;
        local_118 = lVar2;
        local_c8 = lVar2;
        if (*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18) < 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                    ((Stack<rapidjson::CrtAllocator> *)
                     CONCAT17(in_stack_fffffffffffffa97,
                              CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)),
                     in_stack_fffffffffffffa88);
        }
        local_58 = local_120;
        local_60 = *(undefined1 **)(lVar2 + 0x18);
        *(long *)(lVar2 + 0x18) = local_120 + *(long *)(lVar2 + 0x18);
        *local_60 = uVar17;
        local_50 = lVar2;
        *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
      }
      goto LAB_001ec9f3;
    }
    if (local_3c1 == 0x22) {
      GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_3b8->s);
      plVar5 = local_3c0;
      local_1e0 = local_3c0;
      local_1e1 = 0;
      local_68 = *local_3c0;
      local_110 = 1;
      local_e0 = 1;
      local_108 = local_68;
      local_d8 = local_68;
      if (*(long *)(local_68 + 0x20) - *(long *)(local_68 + 0x18) < 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                  ((Stack<rapidjson::CrtAllocator> *)
                   CONCAT17(in_stack_fffffffffffffa97,
                            CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)),
                   in_stack_fffffffffffffa88);
      }
      local_70 = local_110;
      local_78 = *(undefined1 **)(local_68 + 0x18);
      *(long *)(local_68 + 0x18) = local_110 + *(long *)(local_68 + 0x18);
      *local_78 = 0;
      *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
      goto LAB_001eda2c;
    }
    if (local_3c1 < 0x20) {
      if (local_3c1 == 0) {
        GenericStringStream<rapidjson::UTF8<char>_>::Tell(&local_3b8->s);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError(in_stack_fffffffffffffa80,
                      CONCAT13(in_stack_fffffffffffffa7f,
                               CONCAT12(in_stack_fffffffffffffa7e,
                                        CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c
                                                ))),0x1ed80d);
        bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                 ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                  *)0x1ed81a);
        if (bVar14) goto LAB_001eda2c;
      }
      else {
        GenericStringStream<rapidjson::UTF8<char>_>::Tell(&local_3b8->s);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError(in_stack_fffffffffffffa80,
                      CONCAT13(in_stack_fffffffffffffa7f,
                               CONCAT12(in_stack_fffffffffffffa7e,
                                        CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c
                                                ))),0x1ed853);
        bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                 ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                  *)0x1ed860);
        if (bVar14) {
LAB_001eda2c:
          bVar14 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x1eda3d);
          if (!bVar14) {
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            StackStream<char>::Length((StackStream<char> *)&stack0xfffffffffffffbc0);
            this_00 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       *)GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         ::StackStream<char>::Pop((StackStream<char> *)0x1edaba);
            if ((local_401 & 1) == 0) {
              in_stack_fffffffffffffa7d =
                   GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::String(in_stack_fffffffffffffac0,(Ch *)in_stack_fffffffffffffab8,
                            in_stack_fffffffffffffab4,(bool)in_stack_fffffffffffffab3);
              uVar17 = in_stack_fffffffffffffa7d;
            }
            else {
              in_stack_fffffffffffffa7f =
                   GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Key(this_00,(Ch *)CONCAT17(in_stack_fffffffffffffa7f,
                                                CONCAT16(in_stack_fffffffffffffa7e,
                                                         CONCAT15(in_stack_fffffffffffffa7d,
                                                                  CONCAT14(in_stack_fffffffffffffa7c
                                                                           ,
                                                  in_stack_fffffffffffffa78)))),0,false);
              uVar17 = in_stack_fffffffffffffa7f;
            }
            if (((uVar17 ^ 0xff) & 1) != 0) {
              GenericStringStream<rapidjson::UTF8<char>_>::Tell(&local_420.s);
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this_00,
                            CONCAT13(in_stack_fffffffffffffa7f,
                                     CONCAT12(uVar17,CONCAT11(in_stack_fffffffffffffa7d,
                                                              in_stack_fffffffffffffa7c))),0x1edb80)
              ;
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x1edb91);
            }
          }
          internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
          ~StreamLocalCopy(&local_420);
          return;
        }
      }
    }
    else {
      local_3e8 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(&local_3b8->s);
      plVar5 = local_3c0;
      local_1c0 = local_3b8;
      local_1c8 = local_3c0;
      local_1b1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_3b8->s);
      local_1b0 = plVar5;
      in_stack_fffffffffffffab4 = CONCAT13(local_1b1,(int3)in_stack_fffffffffffffab4);
      in_stack_fffffffffffffab8 =
           (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)*plVar5;
      local_130 = 1;
      local_c0 = 1;
      in_stack_fffffffffffffac0 = in_stack_fffffffffffffab8;
      local_128 = in_stack_fffffffffffffab8;
      local_b8 = in_stack_fffffffffffffab8;
      if ((long)(in_stack_fffffffffffffab8->stack_).allocator_ -
          (long)in_stack_fffffffffffffab8->ownAllocator_ < 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                  ((Stack<rapidjson::CrtAllocator> *)
                   CONCAT17(in_stack_fffffffffffffa97,
                            CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)),
                   in_stack_fffffffffffffa88);
      }
      local_40 = local_130;
      in_stack_fffffffffffffa98 =
           (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
           in_stack_fffffffffffffab8->ownAllocator_;
      in_stack_fffffffffffffab8->ownAllocator_ =
           (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
           ((long)&in_stack_fffffffffffffab8->ownAllocator_->chunkHead_ + local_130);
      *(char *)&(in_stack_fffffffffffffa98->stack_).allocator_ =
           (char)(in_stack_fffffffffffffab4 >> 0x18);
      local_48 = in_stack_fffffffffffffa98;
      local_38 = in_stack_fffffffffffffab8;
      *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
    }
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }